

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::AddDeferParseAttribute(FunctionBody *this)

{
  Type TVar1;
  FunctionInfo *pFVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_007763a4;
    *puVar5 = 0;
  }
  if ((FunctionBody *)
      (((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionBodyImpl)
      .ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar4) goto LAB_007763a4;
    *puVar5 = 0;
  }
  pFVar2 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  TVar1 = pFVar2->attributes;
  if (pFVar2 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x54c,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_007763a4;
    *puVar5 = 0;
  }
  if ((FunctionBody *)
      (((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionBodyImpl)
      .ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x54d,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar4) {
LAB_007763a4:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->attributes =
       TVar1 | DeferredParse;
  return;
}

Assistant:

void FunctionBody::AddDeferParseAttribute()
    {
        this->SetAttributes((FunctionInfo::Attributes) (this->GetAttributes() | FunctionInfo::Attributes::DeferredParse));
    }